

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O3

void silent_dependent_async(size_t W)

{
  long *plVar1;
  code *pcVar2;
  double dVar3;
  __mutex_base *p_Var4;
  pointer piVar5;
  undefined8 uVar6;
  char extraout_AL;
  bool bVar7;
  int iVar8;
  time_t tVar9;
  long lVar10;
  __pthread_internal_list *p_Var11;
  __pthread_internal_list *p_Var12;
  vector<int,_std::allocator<int>_> *__range2;
  ulong __new_size;
  int *d;
  __pthread_internal_list *p_Var13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar15;
  vector<int,_std::allocator<int>_> data;
  ResultBuilder DOCTEST_RB;
  Executor executor;
  vector<int,_std::allocator<int>_> local_238;
  undefined1 local_220 [16];
  unique_lock<std::mutex> local_210;
  char *local_200;
  undefined4 local_1f8;
  pointer local_1f0;
  undefined2 local_1e8;
  undefined1 local_1e0;
  undefined7 uStack_1df;
  char local_1c9;
  anon_union_24_2_13149d16_for_String_2 aStack_1c8;
  undefined1 local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 local_198 [32];
  shared_ptr<tf::WorkerInterface> local_178;
  Executor local_168;
  
  tVar9 = time((time_t *)0x0);
  srand((uint)tVar9);
  local_178.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_178.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,W,&local_178);
  if (local_178.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __new_size = 0;
  do {
    std::vector<int,_std::allocator<int>_>::resize(&local_238,__new_size);
    piVar5 = local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    for (p_Var13 = (__pthread_internal_list *)
                   local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; p_Var13 != (__pthread_internal_list *)piVar5;
        p_Var13 = (__pthread_internal_list *)
                  ((long)&((__mutex_base *)&p_Var13->__prev)->_M_mutex + 4)) {
      iVar8 = rand();
      (((__mutex_base *)&p_Var13->__prev)->_M_mutex).__data.__lock = iVar8 % 1000 + -500;
    }
    local_210._M_device =
         (mutex_type *)
         local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    local_210._8_8_ =
         local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tf::Executor::
    silent_dependent_async<tf::DefaultTaskParams,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_sort_hpp:595:10),_tf::AsyncTask_*,_nullptr>
              ((Executor *)local_220,(DefaultTaskParams *)&local_168,
               (anon_class_24_3_b5c2bc7a *)local_198,(AsyncTask *)&local_210,(AsyncTask *)0x0);
    uVar6 = local_220._0_8_;
    if ((void *)local_220._0_8_ != (void *)0x0) {
      lVar10 = local_220._0_8_ + 0x88;
      if (*(char *)(local_220._0_8_ + 0xc0) != '\b') {
        lVar10 = 0;
      }
      LOCK();
      plVar1 = (long *)(lVar10 + 0x28);
      *plVar1 = *plVar1 + -1;
      UNLOCK();
      if (*plVar1 == 0) {
        if ((void *)local_220._0_8_ != (void *)0x0) {
          if (*(long *)(local_220._0_8_ + 0xd0) != 0) {
            std::__exception_ptr::exception_ptr::_M_release();
          }
          if (*(Semaphores **)(uVar6 + 200) != (Semaphores *)0x0) {
            std::default_delete<tf::Node::Semaphores>::operator()
                      ((default_delete<tf::Node::Semaphores> *)(uVar6 + 200),
                       *(Semaphores **)(uVar6 + 200));
          }
          *(undefined8 *)(uVar6 + 200) = 0;
          std::__detail::__variant::
          _Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
          ::~_Variant_storage((_Variant_storage<false,_std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                               *)(uVar6 + 0x88));
          if (*(void **)(uVar6 + 0x48) != (void *)(uVar6 + 0x60)) {
            free(*(void **)(uVar6 + 0x48));
          }
          if (*(long **)(uVar6 + 8) != (long *)(uVar6 + 0x18)) {
            operator_delete(*(long **)(uVar6 + 8),*(long *)(uVar6 + 0x18) + 1);
          }
        }
        operator_delete((void *)uVar6,0xd8);
      }
    }
    local_210._M_device = &local_168._topology_mutex;
    local_210._8_8_ = local_210._8_8_ & 0xffffffffffffff00;
    std::unique_lock<std::mutex>::lock(&local_210);
    local_210._M_owns = true;
    while (local_168._num_topologies != 0) {
      std::condition_variable::wait((unique_lock *)&local_168._topology_cv);
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_210);
    local_1e0 = 0;
    local_1c9 = '\x17';
    aStack_1c8.buf[0] = '\0';
    aStack_1c8.buf[0x17] = '\x17';
    local_210._M_device = *(mutex_type **)(doctest::detail::g_cs + 0x20);
    local_210._8_4_ = 0xc;
    local_200 = 
    "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_sort.cpp";
    local_1f8 = 0x141;
    local_1f0 = (pointer)0x1385a1;
    local_1e8 = 1;
    local_1b0 = 0;
    local_1a8 = "";
    local_1a0 = "";
    p_Var12 = (__pthread_internal_list *)
              local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    p_Var13 = (__pthread_internal_list *)
              local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        p_Var11 = (__pthread_internal_list *)
                  ((long)&((__mutex_base *)&p_Var13->__prev)->_M_mutex + 4);
        p_Var12 = (__pthread_internal_list *)
                  local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (p_Var11 ==
            (__pthread_internal_list *)
            local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) break;
        p_Var4 = (__mutex_base *)&p_Var13->__prev;
        p_Var12 = p_Var11;
        p_Var13 = p_Var11;
      } while ((p_Var4->_M_mutex).__data.__lock <=
               (((__mutex_base *)&p_Var11->__prev)->_M_mutex).__data.__lock);
    }
    local_220._8_8_ =
         (ulong)(p_Var12 ==
                (__pthread_internal_list *)
                local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) | 0xc00000000;
    doctest::detail::Expression_lhs::operator_cast_to_Result
              ((Result *)local_198,(Expression_lhs *)(local_220 + 8));
    doctest::String::operator=((String *)&aStack_1c8.data,(String *)(local_198 + 8));
    local_1e8 = CONCAT11(local_1e8._1_1_,local_198[0]) ^ 1;
    uVar14 = extraout_XMM0_Da;
    uVar15 = extraout_XMM0_Db;
    if (((char)local_198[0x1f] < '\0') && ((char *)local_198._8_8_ != (char *)0x0)) {
      operator_delete__((void *)local_198._8_8_);
      uVar14 = extraout_XMM0_Da_00;
      uVar15 = extraout_XMM0_Db_00;
    }
    dVar3 = doctest::detail::ResultBuilder::log
                      ((ResultBuilder *)&local_210,(double)CONCAT44(uVar15,uVar14));
    if (extraout_AL != '\0') {
      pcVar2 = (code *)swi(3);
      (*pcVar2)(SUB84(dVar3,0));
      return;
    }
    if ((char)local_1e8 == '\x01') {
      bVar7 = doctest::detail::checkIfShouldThrow(local_210._8_4_);
      if (bVar7) {
        doctest::detail::throwException();
      }
    }
    if ((aStack_1c8.buf[0x17] < '\0') &&
       ((void *)CONCAT71(aStack_1c8._1_7_,aStack_1c8.buf[0]) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(aStack_1c8._1_7_,aStack_1c8.buf[0]));
    }
    if ((local_1c9 < '\0') && ((void *)CONCAT71(uStack_1df,local_1e0) != (void *)0x0)) {
      operator_delete__((void *)CONCAT71(uStack_1df,local_1e0));
    }
    bVar7 = __new_size == 0;
    __new_size = __new_size * 10;
    if (bVar7) {
      __new_size = 1;
    }
    if (99999 < __new_size) {
      if ((__pthread_internal_list *)
          local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (__pthread_internal_list *)0x0) {
        operator_delete(local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_238.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      tf::Executor::~Executor(&local_168);
      return;
    }
  } while( true );
}

Assistant:

void silent_dependent_async(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));
  
  tf::Executor executor(W);
  std::vector<int> data;

  for(size_t n=0; n < 100000; n = (n ? n*10 : 1)) {
    
    data.resize(n);

    for(auto& d : data) {
      d = ::rand() % 1000 - 500;
    }
  
    executor.silent_dependent_async(tf::make_sort_task(data.begin(), data.end()));
    executor.wait_for_all();
    REQUIRE(std::is_sorted(data.begin(), data.end()));
  }
}